

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

char * __thiscall
Messages::Person_PhoneNumber::_InternalParse(Person_PhoneNumber *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  uint64 val_00;
  UnknownFieldSet *unknown;
  Container<google::protobuf::UnknownFieldSet> *pCVar2;
  ulong uVar3;
  uint64 val;
  string *str;
  Arena *pAStack_60;
  uint32 tag;
  Arena *arena;
  ParseContext *pPStack_50;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  Person_PhoneNumber *this_local;
  Person_PhoneNumber *local_30;
  undefined1 *local_28;
  UnknownFieldSet *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  
  this_local = (Person_PhoneNumber *)((long)&arena + 4);
  pPStack_50 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  local_30 = this_local;
  memset(this_local,0,4);
  pAStack_60 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
LAB_0010e96c:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_50,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0010eb84;
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag((char *)ctx_local,(uint32 *)((long)&str + 4),0);
    if (ctx_local == (ParseContext *)0x0) goto LAB_0010eba2;
    if (str._4_4_ >> 3 == 1) {
      if ((str._4_4_ & 0xff) != 10) goto LAB_0010eac3;
      s = _internal_mutable_number_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            ((string *)s,(char *)ctx_local,pPStack_50);
      google::protobuf::internal::VerifyUTF8(s,"Messages.Person.PhoneNumber.number");
    }
    else {
      if ((str._4_4_ >> 3 == 2) && ((str._4_4_ & 0xff) == 0x10)) {
        val_00 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) goto LAB_0010eba2;
        bVar1 = Person_PhoneType_IsValid((Person_PhoneType)val_00);
        if (bVar1) {
          _internal_set_type(this,(Person_PhoneType)val_00);
        }
        else {
          unknown = mutable_unknown_fields(this);
          google::protobuf::internal::WriteVarint(2,val_00,unknown);
        }
        goto LAB_0010e96c;
      }
LAB_0010eac3:
      if (((str._4_4_ & 7) == 4) || (str._4_4_ == 0)) {
        google::protobuf::internal::EpsCopyInputStream::SetLastTag
                  (&pPStack_50->super_EpsCopyInputStream,str._4_4_);
        goto LAB_0010eb84;
      }
      uVar3 = (ulong)str._4_4_;
      local_28 = &this->field_0x8;
      local_18 = local_28;
      local_10 = local_28;
      if (((uint)*(undefined8 *)local_28 & 1) == 1) {
        pCVar2 = google::protobuf::internal::InternalMetadata::
                 PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                           ((InternalMetadata *)local_28);
        local_20 = &pCVar2->unknown_fields;
      }
      else {
        local_20 = google::protobuf::internal::InternalMetadata::
                   mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                             ((InternalMetadata *)local_28);
      }
      ctx_local = (ParseContext *)
                  google::protobuf::internal::UnknownFieldParse
                            (uVar3,local_20,(char *)ctx_local,pPStack_50);
    }
    if (ctx_local == (ParseContext *)0x0) {
LAB_0010eba2:
      ctx_local = (ParseContext *)0x0;
LAB_0010eb84:
      google::protobuf::internal::HasBits<1UL>::Or
                (&this->_has_bits_,(HasBits<1UL> *)((long)&arena + 4));
      return (char *)ctx_local;
    }
  } while( true );
}

Assistant:

const char* Person_PhoneNumber::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // required string number = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_number();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.PhoneNumber.number");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .Messages.Person.PhoneType type = 2 [default = HOME];
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::Messages::Person_PhoneType_IsValid(val))) {
            _internal_set_type(static_cast<::Messages::Person_PhoneType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(2, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}